

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

string * __thiscall
deqp::gls::getShaderInfoLog_abi_cxx11_(string *__return_storage_ptr__,gls *this,deUint32 shaderGL)

{
  int infoLogLen;
  vector<char,_std::allocator<char>_> infoLog;
  allocator<char> local_2d;
  GLint local_2c;
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  local_2c = 0;
  local_28._M_impl.super__Vector_impl_data._M_start = (GLchar *)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glwGetShaderiv((GLuint)this,0x8b84,&local_2c);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&local_28,(long)(local_2c + 1));
  glwGetShaderInfoLog((GLuint)this,
                      (int)local_28._M_impl.super__Vector_impl_data._M_finish -
                      (int)local_28._M_impl.super__Vector_impl_data._M_start,(GLsizei *)0x0,
                      local_28._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28._M_impl.super__Vector_impl_data._M_start,
             &local_2d);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static inline string getShaderInfoLog (const deUint32 shaderGL)
{
	int				infoLogLen = 0;
	vector<char>	infoLog;
	glGetShaderiv(shaderGL, GL_INFO_LOG_LENGTH, &infoLogLen);
	infoLog.resize(infoLogLen+1);
	glGetShaderInfoLog(shaderGL, (int)infoLog.size(), DE_NULL, &infoLog[0]);
	return &infoLog[0];
}